

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cc
# Opt level: O1

Renderer * __thiscall SDL2pp::Renderer::operator=(Renderer *this,Renderer *other)

{
  if (other != this) {
    if (this->renderer_ != (SDL_Renderer *)0x0) {
      SDL_DestroyRenderer();
    }
    this->renderer_ = other->renderer_;
    other->renderer_ = (SDL_Renderer *)0x0;
  }
  return this;
}

Assistant:

Renderer& Renderer::operator=(Renderer&& other) noexcept {
	if (&other == this)
		return *this;
	if (renderer_ != nullptr)
		SDL_DestroyRenderer(renderer_);
	renderer_ = other.renderer_;
	other.renderer_ = nullptr;
	return *this;
}